

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  byte bVar4;
  long lVar5;
  size_t size;
  undefined1 *puVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  buffer<char> *c;
  ulong uVar10;
  char __tmp;
  size_t __len;
  size_t __n;
  
  uVar8 = (ulong)(uint)specs->width;
  uVar9 = 4 - (ulong)(f->sign == none);
  puVar2 = *(undefined8 **)this;
  lVar5 = puVar2[2];
  __n = uVar8 - uVar9;
  if (uVar8 < uVar9 || __n == 0) {
    uVar9 = uVar9 + lVar5;
    if ((ulong)puVar2[3] < uVar9) {
      (**(code **)*puVar2)(puVar2,uVar9);
    }
    puVar2[2] = uVar9;
    puVar6 = (undefined1 *)(lVar5 + puVar2[1]);
    if ((ulong)f->sign != 0) {
      *puVar6 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      puVar6 = puVar6 + 1;
    }
    pcVar3 = f->str;
    lVar5 = 0;
    do {
      puVar6[lVar5] = pcVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  else {
    uVar10 = lVar5 + uVar8;
    if ((ulong)puVar2[3] < uVar10) {
      (**(code **)*puVar2)(puVar2,uVar10);
    }
    puVar2[2] = uVar10;
    puVar6 = (undefined1 *)(lVar5 + puVar2[1]);
    bVar1 = (specs->fill).data_[0];
    bVar4 = specs->field_0x9 & 0xf;
    if (bVar4 == 3) {
      uVar10 = __n >> 1;
      puVar7 = puVar6;
      if (1 < __n) {
        puVar7 = puVar6 + uVar10;
        switchD_0105b559::default(puVar6,(uint)bVar1,uVar10);
      }
      if ((ulong)f->sign != 0) {
        *puVar7 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
        puVar7 = puVar7 + 1;
      }
      pcVar3 = f->str;
      lVar5 = 0;
      do {
        puVar7[lVar5] = pcVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      if (uVar8 != uVar9) {
        __n = __n - uVar10;
        puVar6 = puVar7;
LAB_00d9517f:
        switchD_0105b559::default(puVar6 + 3,(uint)bVar1,__n);
        return;
      }
    }
    else if (bVar4 == 2) {
      puVar7 = puVar6;
      if (uVar8 != uVar9) {
        puVar7 = puVar6 + __n;
        switchD_0105b559::default(puVar6,(uint)bVar1,__n);
      }
      if ((ulong)f->sign != 0) {
        *puVar7 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
        puVar7 = puVar7 + 1;
      }
      pcVar3 = f->str;
      lVar5 = 0;
      do {
        puVar7[lVar5] = pcVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
    else {
      if ((ulong)f->sign != 0) {
        *puVar6 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
        puVar6 = puVar6 + 1;
      }
      pcVar3 = f->str;
      lVar5 = 0;
      do {
        puVar6[lVar5] = pcVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      if (uVar8 != uVar9) goto LAB_00d9517f;
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }